

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

int queue_segment_start(mixed_segment *segment)

{
  void *pvVar1;
  byte local_22;
  byte local_21;
  mixed_channel_t i_1;
  mixed_channel_t i;
  queue_segment_data *data;
  mixed_segment *segment_local;
  
  pvVar1 = segment->data;
  for (local_21 = 0; (uint)local_21 < *(uint *)((long)pvVar1 + 0x18); local_21 = local_21 + 1) {
    if (*(long *)(*(long *)((long)pvVar1 + 0x10) + (ulong)local_21 * 8) == 0) {
      mixed_err(0x16);
      return 0;
    }
  }
  local_22 = 0;
  while( true ) {
    if (*(uint *)((long)pvVar1 + 0x28) <= (uint)local_22) {
      return 1;
    }
    if (*(long *)(*(long *)((long)pvVar1 + 0x20) + (ulong)local_22 * 8) == 0) break;
    local_22 = local_22 + 1;
  }
  mixed_err(0x16);
  return 0;
}

Assistant:

int queue_segment_start(struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  for(mixed_channel_t i=0; i<data->out_count; ++i){
    if(data->out[i] == 0){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  for(mixed_channel_t i=0; i<data->in_count; ++i){
    if(data->in[i] == 0){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  return 1;
}